

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void int_div(IntVar *x,IntVar *y,IntVar *z)

{
  IntView<0> _y;
  IntView<1> _y_00;
  IntView<0> _y_01;
  IntView<1> _y_02;
  IntView<4> _x;
  IntView<0> _x_00;
  IntView<1> _x_01;
  IntView<5> _x_02;
  IntView<4> _z;
  IntView<1> _z_00;
  IntView<1> _z_01;
  IntView<4> _z_02;
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  IntVar *pIVar4;
  IntVar *in_RDX;
  IntVar *in_RSI;
  IntVar *in_RDI;
  bool z_flip;
  bool y_flip;
  bool x_flip;
  IntVar *in_stack_fffffffffffffe28;
  Divide<4,_0,_4> *in_stack_fffffffffffffe40;
  IntVar *in_stack_fffffffffffffe48;
  FILE *pFVar5;
  undefined8 in_stack_fffffffffffffe50;
  IntVar *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  IntVar *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  IntView<0> local_180;
  IntView<4> local_170;
  IntView<0> local_160;
  IntView<1> local_150;
  IntView<0> local_140;
  IntView<5> local_130;
  IntView<0> local_120;
  IntView<1> local_110;
  IntView<0> local_100;
  IntView<0> local_f0;
  IntView<1> local_e0;
  IntView<0> local_d0;
  IntView<1> local_c0;
  IntView<0> local_b0;
  IntView<1> local_a0;
  IntView<0> local_90;
  IntView<0> local_80;
  IntView<4> local_70;
  IntView<0> local_60 [2];
  IntView<0> local_40;
  IntView<4> local_30;
  undefined1 local_1b;
  byte local_1a;
  byte local_19;
  IntVar *local_18;
  IntVar *local_10;
  IntVar *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = get_sign(in_stack_fffffffffffffe28);
  if (((iVar1 == 0) || (iVar1 = get_sign(in_stack_fffffffffffffe28), iVar1 == 0)) ||
     (iVar1 = get_sign(in_stack_fffffffffffffe28), iVar1 == 0)) {
    pFVar5 = _stderr;
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
      ;
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                       ,0x2f);
      pcVar2 = pcVar2 + 1;
    }
    fprintf(pFVar5,"%s:%d: ",pcVar2,0x29c);
    fprintf(_stderr,"Cannot handle non-sign-fixed vars\n");
    abort();
  }
  iVar1 = get_sign(in_stack_fffffffffffffe28);
  local_19 = iVar1 == -1;
  iVar1 = get_sign(in_stack_fffffffffffffe28);
  local_1a = iVar1 == -1;
  iVar1 = get_sign(in_stack_fffffffffffffe28);
  local_1b = iVar1 == -1;
  if ((((local_19 & 1) != 0) || ((local_1a & 1) != 0)) || ((bool)local_1b)) {
    if ((((local_19 & 1) == 0) && ((local_1a & 1) != 0)) && ((bool)local_1b)) {
      pvVar3 = operator_new(0x50);
      IntView<0>::IntView(&local_90,local_8,1,0);
      IntView<0>::IntView(&local_b0,local_10,1,0);
      IntView<1>::IntView<0>(&local_a0,&local_b0);
      IntView<0>::IntView(&local_d0,local_18,1,0);
      IntView<1>::IntView<0>(&local_c0,&local_d0);
      _x_00._8_8_ = pvVar3;
      _x_00.var = in_stack_fffffffffffffe58;
      _y_00.a = (int)in_stack_fffffffffffffe50;
      _y_00.b = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
      _y_00.var = in_stack_fffffffffffffe48;
      _z_00.a = (int)in_stack_fffffffffffffe78;
      _z_00.b = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      _z_00.var = in_stack_fffffffffffffe70;
      Divide<0,_1,_1>::Divide((Divide<0,_1,_1> *)in_stack_fffffffffffffe40,_x_00,_y_00,_z_00);
    }
    else if ((((local_19 & 1) == 0) || ((local_1a & 1) != 0)) || (!(bool)local_1b)) {
      if ((((local_19 & 1) == 0) || ((local_1a & 1) == 0)) || ((bool)local_1b)) {
        pFVar5 = _stderr;
        pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
          ;
        }
        else {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                           ,0x2f);
          pcVar2 = pcVar2 + 1;
        }
        fprintf(pFVar5,"%s:%d: ",pcVar2,0x2af);
        fprintf(_stderr,"Cannot handle this case\n");
        abort();
      }
      pvVar3 = operator_new(0x50);
      IntView<0>::IntView(&local_140,local_8,1,1);
      IntView<5>::IntView<0>(&local_130,&local_140);
      IntView<0>::IntView(&local_160,local_10,1,0);
      IntView<1>::IntView<0>(&local_150,&local_160);
      IntView<0>::IntView(&local_180,local_18,1,1);
      IntView<4>::IntView<0>(&local_170,&local_180);
      _x_02.a = (int)in_stack_fffffffffffffe60;
      _x_02.b = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      _x_02.var = in_stack_fffffffffffffe58;
      _y_02._8_8_ = pvVar3;
      _y_02.var = in_stack_fffffffffffffe48;
      _z_02.a = (int)in_stack_fffffffffffffe78;
      _z_02.b = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      _z_02.var = in_stack_fffffffffffffe70;
      Divide<5,_1,_4>::Divide((Divide<5,_1,_4> *)in_stack_fffffffffffffe40,_x_02,_y_02,_z_02);
    }
    else {
      pIVar4 = (IntVar *)operator_new(0x50);
      IntView<0>::IntView(&local_f0,local_8,1,0);
      IntView<1>::IntView<0>(&local_e0,&local_f0);
      IntView<0>::IntView(&local_100,local_10,1,0);
      IntView<0>::IntView(&local_120,local_18,1,0);
      IntView<1>::IntView<0>(&local_110,&local_120);
      _x_01.a = (int)in_stack_fffffffffffffe60;
      _x_01.b = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      _x_01.var = pIVar4;
      _y_01.a = (int)in_stack_fffffffffffffe50;
      _y_01.b = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
      _y_01.var = in_stack_fffffffffffffe48;
      _z_01.a = (int)in_stack_fffffffffffffe78;
      _z_01.b = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      _z_01.var = in_stack_fffffffffffffe70;
      Divide<1,_0,_1>::Divide((Divide<1,_0,_1> *)in_stack_fffffffffffffe40,_x_01,_y_01,_z_01);
    }
  }
  else {
    operator_new(0x50);
    IntView<0>::IntView(&local_40,local_8,1,1);
    IntView<4>::IntView<0>(&local_30,&local_40);
    IntView<0>::IntView(local_60,local_10,1,0);
    IntView<0>::IntView(&local_80,local_18,1,1);
    IntView<4>::IntView<0>(&local_70,&local_80);
    _x.a = (int)in_stack_fffffffffffffe60;
    _x.b = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    _x.var = in_stack_fffffffffffffe58;
    _y.a = (int)in_stack_fffffffffffffe50;
    _y.b = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    _y.var = in_stack_fffffffffffffe48;
    _z.a = (int)in_stack_fffffffffffffe78;
    _z.b = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    _z.var = in_stack_fffffffffffffe70;
    Divide<4,_0,_4>::Divide(in_stack_fffffffffffffe40,_x,_y,_z);
  }
  return;
}

Assistant:

void int_div(IntVar* x, IntVar* y, IntVar* z) {
	if ((get_sign(x) == 0) || (get_sign(y) == 0) || (get_sign(z) == 0)) {
		CHUFFED_ERROR("Cannot handle non-sign-fixed vars\n");
	}
	const bool x_flip = (get_sign(x) == -1);
	const bool y_flip = (get_sign(y) == -1);
	const bool z_flip = (get_sign(z) == -1);

	if (!x_flip && !y_flip && !z_flip) {
		// ceil(x+1 / y) = z+1
		new Divide<4, 0, 4>(IntView<>(x, 1, 1), IntView<>(y), IntView<>(z, 1, 1));
	} else if (!x_flip && y_flip && z_flip) {
		// ceil(x / -y) = -z
		new Divide<0, 1, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else if (x_flip && !y_flip && z_flip) {
		// ceil(-x / y) = -z
		new Divide<1, 0, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else if (x_flip && y_flip && !z_flip) {
		// ceil(-x+1 / -y) = z+1
		new Divide<5, 1, 4>(IntView<>(x, 1, 1), IntView<>(y), IntView<>(z, 1, 1));
	} else {
		CHUFFED_ERROR("Cannot handle this case\n");
	}
}